

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

wchar_t cmd_get_effect_from_list
                  (command *cmd,char *arg,int *choice,char *prompt,effect *effect,wchar_t count,
                  _Bool allow_random)

{
  wchar_t wVar1;
  effect *local_50;
  effect *cursor;
  byte local_3d;
  wchar_t selection;
  _Bool allow_random_local;
  effect *peStack_38;
  wchar_t count_local;
  effect *effect_local;
  char *prompt_local;
  int *choice_local;
  char *arg_local;
  command *cmd_local;
  
  local_3d = allow_random;
  selection = count;
  peStack_38 = effect;
  effect_local = (effect *)prompt;
  prompt_local = (char *)choice;
  choice_local = (int *)arg;
  arg_local = (char *)cmd;
  if (count == L'\xffffffff') {
    selection = L'\0';
    for (local_50 = effect; local_50 != (effect *)0x0; local_50 = effect_next(local_50)) {
      selection = selection + L'\x01';
    }
  }
  wVar1 = cmd_get_arg_choice((command *)arg_local,(char *)choice_local,(int *)((long)&cursor + 4));
  if ((wVar1 != L'\0') ||
     (((cursor._4_4_ != L'\xfffffffe' || ((local_3d & 1) == 0)) &&
      ((cursor._4_4_ < L'\0' || (selection <= cursor._4_4_)))))) {
    cursor._4_4_ = get_effect_from_list
                             ((char *)effect_local,peStack_38,selection,(_Bool)(local_3d & 1));
  }
  if (((cursor._4_4_ == L'\xfffffffe') && ((local_3d & 1) != 0)) ||
     ((L'\xffffffff' < cursor._4_4_ && (cursor._4_4_ < selection)))) {
    cmd_set_arg_choice((command *)arg_local,(char *)choice_local,cursor._4_4_);
    *(wchar_t *)prompt_local = cursor._4_4_;
    cmd_local._4_4_ = L'\0';
  }
  else {
    cmd_local._4_4_ = L'\xfffffffd';
  }
  return cmd_local._4_4_;
}

Assistant:

int cmd_get_effect_from_list(struct command *cmd, const char *arg, int *choice,
	const char *prompt, struct effect *effect, int count,
	bool allow_random)
{
	int selection;

	if (count == -1) {
		struct effect *cursor = effect;

		count = 0;
		while (cursor) {
			++count;
			cursor = effect_next(cursor);
		}
	}

	if (cmd_get_arg_choice(cmd, arg, &selection) != CMD_OK ||
			((selection != -2 || !allow_random) &&
			(selection < 0 || selection >= count))) {
		/* It isn't in the command or is invalid; prompt. */
		selection = get_effect_from_list(prompt, effect, count,
			allow_random);
	}
	if ((selection == -2 && allow_random) ||
			(selection >= 0 && selection < count)) {
		/* Record the selection in the command. */
		cmd_set_arg_choice(cmd, arg, selection);
		*choice = selection;
		return CMD_OK;
	}
	return CMD_ARG_ABORTED;
}